

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O2

UTimeZoneNameTypeIndex icu_63::ZNames::ZNamesLoader::nameTypeFromKey(char *key)

{
  char cVar1;
  char cVar2;
  UTimeZoneNameTypeIndex UVar3;
  
  cVar1 = *key;
  if (((cVar1 != '\0') && (cVar2 = key[1], cVar2 != '\0')) && (key[2] == '\0')) {
    if (cVar1 == 's') {
      if (cVar2 == 'g') {
        UVar3 = UTZNM_INDEX_SHORT_GENERIC;
      }
      else {
        if (cVar2 != 's') {
          return -(uint)(cVar2 != 'd') | UTZNM_INDEX_SHORT_DAYLIGHT;
        }
        UVar3 = UTZNM_INDEX_SHORT_STANDARD;
      }
    }
    else {
      if (cVar1 != 'l') {
        return -(uint)(cVar2 != 'c' || cVar1 != 'e');
      }
      if (cVar2 == 'g') {
        UVar3 = UTZNM_INDEX_LONG_GENERIC;
      }
      else {
        if (cVar2 != 's') {
          return (uint)(cVar2 == 'd') * 4 + UTZNM_INDEX_UNKNOWN;
        }
        UVar3 = UTZNM_INDEX_LONG_STANDARD;
      }
    }
    return UVar3;
  }
  return UTZNM_INDEX_UNKNOWN;
}

Assistant:

static UTimeZoneNameTypeIndex nameTypeFromKey(const char *key) {
        char c0, c1;
        if ((c0 = key[0]) == 0 || (c1 = key[1]) == 0 || key[2] != 0) {
            return UTZNM_INDEX_UNKNOWN;
        }
        if (c0 == 'l') {
            return c1 == 'g' ? UTZNM_INDEX_LONG_GENERIC :
                    c1 == 's' ? UTZNM_INDEX_LONG_STANDARD :
                        c1 == 'd' ? UTZNM_INDEX_LONG_DAYLIGHT : UTZNM_INDEX_UNKNOWN;
        } else if (c0 == 's') {
            return c1 == 'g' ? UTZNM_INDEX_SHORT_GENERIC :
                    c1 == 's' ? UTZNM_INDEX_SHORT_STANDARD :
                        c1 == 'd' ? UTZNM_INDEX_SHORT_DAYLIGHT : UTZNM_INDEX_UNKNOWN;
        } else if (c0 == 'e' && c1 == 'c') {
            return UTZNM_INDEX_EXEMPLAR_LOCATION;
        }
        return UTZNM_INDEX_UNKNOWN;
    }